

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O2

size_t mbedtls_mpi_core_bitlen(mbedtls_mpi_uint *A,size_t A_limbs)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = A_limbs & 0xffffffff;
  lVar2 = uVar3 * 0x40 + 0x40;
  do {
    if ((int)uVar3 < 1) {
      return 0;
    }
    uVar1 = A[uVar3 - 1];
    uVar3 = uVar3 - 1;
    lVar2 = lVar2 + -0x40;
  } while (uVar1 == 0);
  uVar3 = 0x3f;
  if (uVar1 != 0) {
    for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  return lVar2 - (uVar3 ^ 0x3f);
}

Assistant:

size_t mbedtls_mpi_core_bitlen(const mbedtls_mpi_uint *A, size_t A_limbs)
{
    int i;
    size_t j;

    for (i = ((int) A_limbs) - 1; i >= 0; i--) {
        if (A[i] != 0) {
            j = biL - mbedtls_mpi_core_clz(A[i]);
            return (i * biL) + j;
        }
    }

    return 0;
}